

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairList.cpp
# Opt level: O3

bool __thiscall OpenMD::PairList::hasPair(PairList *this,int i,int j)

{
  ulong uVar1;
  iterator iVar2;
  ulong uVar3;
  key_type local_10;
  
  if (i == j) {
    return false;
  }
  uVar1 = (ulong)(uint)j;
  if (j < i) {
    uVar1 = (ulong)(uint)i;
  }
  uVar3 = (ulong)(uint)j;
  if (i < j) {
    uVar3 = (ulong)(uint)i;
  }
  local_10 = (key_type)(uVar3 | uVar1 << 0x20);
  iVar2 = std::
          _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          ::find((_Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                  *)this,&local_10);
  return (_Rb_tree_header *)iVar2._M_node != &(this->pairSet_)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool PairList::hasPair(int i, int j) {
    if (i == j) {
      return false;
    } else if (i > j) {
      std::swap(i, j);
    }

    std::set<std::pair<int, int>>::iterator iter =
        pairSet_.find(std::make_pair(i, j));
    return iter == pairSet_.end() ? false : true;
  }